

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O2

void secp256k1_modinv32_var(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  int32_t iVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  long lVar7;
  undefined8 uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  char *pcVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int alen;
  int local_114;
  secp256k1_modinv32_trans2x2 t;
  secp256k1_modinv32_signed30 f;
  secp256k1_modinv32_signed30 g;
  secp256k1_modinv32_signed30 d;
  secp256k1_modinv32_signed30 local_54;
  
  d.v[4] = 0;
  d.v[5] = 0;
  d.v[6] = 0;
  d.v[7] = 0;
  d.v[8] = 0;
  d.v[0] = 0;
  d.v[1] = 0;
  d.v[2] = 0;
  d.v[3] = 0;
  local_54.v[5] = 0;
  local_54.v[6] = 0;
  local_54.v[7] = 0;
  local_54.v[8] = 0;
  local_54.v[1] = 0;
  local_54.v[2] = 0;
  local_54.v[3] = 0;
  local_54.v[4] = 0;
  local_54.v[0] = 1;
  f.v[8] = (modinfo->modulus).v[8];
  f.v._0_8_ = *(undefined8 *)(modinfo->modulus).v;
  f.v._8_8_ = *(undefined8 *)((modinfo->modulus).v + 2);
  f.v._16_8_ = *(undefined8 *)((modinfo->modulus).v + 4);
  f.v._24_8_ = *(undefined8 *)((modinfo->modulus).v + 6);
  g.v[8] = x->v[8];
  g.v._0_8_ = *(undefined8 *)x->v;
  g.v._8_8_ = *(undefined8 *)(x->v + 2);
  g.v._16_8_ = *(undefined8 *)(x->v + 4);
  g.v._24_8_ = *(undefined8 *)(x->v + 6);
  local_114 = 0;
  alen = 9;
  iVar13 = -1;
  while( true ) {
    iVar16 = 1;
    iVar1 = f.v[0];
    iVar2 = g.v[0];
    iVar17 = 0;
    iVar11 = 0x1e;
    iVar15 = 0;
    uVar5 = f.v[0];
    uVar9 = g.v[0];
    iVar19 = iVar16;
    while( true ) {
      iVar3 = secp256k1_ctz32_var(-1 << ((byte)iVar11 & 0x1f) | uVar9);
      bVar6 = (byte)iVar3;
      uVar9 = uVar9 >> (bVar6 & 0x1f);
      iVar16 = iVar16 << (bVar6 & 0x1f);
      iVar15 = iVar15 << (bVar6 & 0x1f);
      iVar13 = iVar13 - iVar3;
      iVar11 = iVar11 - iVar3;
      if (iVar11 == 0) break;
      if ((uVar5 & 1) == 0) {
        pcVar14 = "test condition failed: (f & 1) == 1";
        uVar8 = 0x117;
        goto LAB_00133e6d;
      }
      if ((uVar9 & 1) == 0) {
        pcVar14 = "test condition failed: (g & 1) == 1";
        uVar8 = 0x118;
        goto LAB_00133e6d;
      }
      bVar6 = 0x1e - (char)iVar11;
      if (iVar15 * iVar2 + iVar16 * iVar1 != uVar5 << (bVar6 & 0x1f)) {
        pcVar14 = "test condition failed: (u * f0 + v * g0) == f << (30 - i)";
        uVar8 = 0x119;
        goto LAB_00133e6d;
      }
      if (iVar19 * iVar2 + iVar17 * iVar1 != uVar9 << (bVar6 & 0x1f)) {
        pcVar14 = "test condition failed: (q * f0 + r * g0) == g << (30 - i)";
        uVar8 = 0x11a;
        goto LAB_00133e6d;
      }
      if (iVar13 - 0x2f0U < 0xfffffa21) {
        pcVar14 = "test condition failed: eta >= -751 && eta <= 751";
        uVar8 = 0x11c;
        goto LAB_00133e6d;
      }
      iVar3 = iVar17;
      iVar4 = iVar19;
      if (iVar13 < 0) {
        iVar13 = -iVar13;
        uVar12 = -uVar5;
        uVar5 = uVar9;
        uVar9 = uVar12;
        iVar3 = -iVar16;
        iVar4 = -iVar15;
        iVar16 = iVar17;
        iVar15 = iVar19;
      }
      iVar19 = iVar13 + 1;
      if (iVar11 <= iVar13 + 1) {
        iVar19 = iVar11;
      }
      if (iVar19 - 0x1fU < 0xffffffe2) {
        pcVar14 = "test condition failed: limit > 0 && limit <= 30";
        uVar8 = 0x12a;
        goto LAB_00133e6d;
      }
      uVar12 = (uint)(0xff << (-(char)iVar19 & 0x1fU)) >> (-(char)iVar19 & 0x1fU);
      uVar18 = secp256k1_modinv32_inv256[uVar5 >> 1 & 0x7f] * uVar9 & uVar12;
      uVar9 = uVar9 + uVar18 * uVar5;
      iVar17 = uVar18 * iVar16 + iVar3;
      iVar19 = uVar18 * iVar15 + iVar4;
      if ((uVar9 & uVar12) != 0) {
        pcVar14 = "test condition failed: (g & m) == 0";
        uVar8 = 0x132;
        goto LAB_00133e6d;
      }
    }
    t.u = iVar16;
    t.v = iVar15;
    t.q = iVar17;
    t.r = iVar19;
    if ((long)iVar19 * (long)iVar16 - (long)iVar17 * (long)iVar15 != 0x40000000) {
      pcVar14 = 
      "test condition failed: (int64_t)t->u * t->r - (int64_t)t->v * t->q == ((int64_t)1) << 30";
      uVar8 = 0x13d;
      goto LAB_00133e6d;
    }
    secp256k1_modinv32_update_de_30(&d,&local_54,&t,modinfo);
    iVar11 = secp256k1_modinv32_mul_cmp_30(&f,alen,&modinfo->modulus,-1);
    if (iVar11 < 1) {
      pcVar14 = 
      "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0";
      uVar8 = 0x25b;
      goto LAB_00133e6d;
    }
    iVar11 = secp256k1_modinv32_mul_cmp_30(&f,alen,&modinfo->modulus,1);
    if (0 < iVar11) {
      pcVar14 = 
      "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0";
      uVar8 = 0x25c;
      goto LAB_00133e6d;
    }
    iVar11 = secp256k1_modinv32_mul_cmp_30(&g,alen,&modinfo->modulus,-1);
    if (iVar11 < 1) {
      pcVar14 = 
      "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0";
      uVar8 = 0x25d;
      goto LAB_00133e6d;
    }
    iVar11 = secp256k1_modinv32_mul_cmp_30(&g,alen,&modinfo->modulus,1);
    if (-1 < iVar11) {
      pcVar14 = 
      "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0";
      uVar8 = 0x25e;
      goto LAB_00133e6d;
    }
    secp256k1_modinv32_update_fg_30_var(alen,&f,&g,&t);
    lVar10 = (long)alen;
    if (g.v[0] == 0) {
      uVar5 = 0;
      for (lVar7 = 1; lVar7 < lVar10; lVar7 = lVar7 + 1) {
        uVar5 = uVar5 | g.v[lVar7];
      }
      if (uVar5 == 0) {
        iVar13 = secp256k1_modinv32_mul_cmp_30(&g,alen,&SECP256K1_SIGNED30_ONE,0);
        if (iVar13 == 0) {
          iVar13 = secp256k1_modinv32_mul_cmp_30(&f,alen,&SECP256K1_SIGNED30_ONE,-1);
          if (((iVar13 == 0) ||
              (iVar13 = secp256k1_modinv32_mul_cmp_30(&f,alen,&SECP256K1_SIGNED30_ONE,1),
              iVar13 == 0)) ||
             ((iVar13 = secp256k1_modinv32_mul_cmp_30(x,9,&SECP256K1_SIGNED30_ONE,0), iVar13 == 0 &&
              ((iVar13 = secp256k1_modinv32_mul_cmp_30(&d,9,&SECP256K1_SIGNED30_ONE,0), iVar13 == 0
               && (iVar13 = secp256k1_modinv32_mul_cmp_30(&f,alen,&modinfo->modulus,1), iVar13 == 0)
               ))))) {
            secp256k1_modinv32_normalize_30(&d,f.v[lVar10 + -1],modinfo);
            x->v[8] = d.v[8];
            *(undefined8 *)(x->v + 4) = d.v._16_8_;
            *(undefined8 *)(x->v + 6) = d.v._24_8_;
            *(undefined8 *)x->v = d.v._0_8_;
            *(undefined8 *)(x->v + 2) = d.v._8_8_;
            return;
          }
          pcVar14 = 
          "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, -1) == 0 || secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, 1) == 0 || (secp256k1_modinv32_mul_cmp_30(x, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 && secp256k1_modinv32_mul_cmp_30(&d, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 && secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) == 0)"
          ;
          uVar8 = 0x28a;
        }
        else {
          pcVar14 = 
          "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, len, &SECP256K1_SIGNED30_ONE, 0) == 0"
          ;
          uVar8 = 0x284;
        }
        goto LAB_00133e6d;
      }
    }
    iVar11 = f.v[lVar10 + -1];
    iVar16 = g.v[lVar10 + -1];
    iVar19 = alen + -2;
    if (iVar16 >> 0x1f == iVar16 && (iVar11 >> 0x1f == iVar11 && -1 < iVar19)) {
      alen = alen + -1;
      f.v[iVar19] = f.v[iVar19] | iVar11 << 0x1e;
      g.v[iVar19] = g.v[iVar19] | iVar16 << 0x1e;
    }
    if (local_114 == 0x18) {
      pcVar14 = "test condition failed: ++i < 25";
      uVar8 = 0x279;
      goto LAB_00133e6d;
    }
    iVar11 = secp256k1_modinv32_mul_cmp_30(&f,alen,&modinfo->modulus,-1);
    if (iVar11 < 1) {
      pcVar14 = 
      "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0";
      uVar8 = 0x27a;
      goto LAB_00133e6d;
    }
    iVar11 = secp256k1_modinv32_mul_cmp_30(&f,alen,&modinfo->modulus,1);
    if (0 < iVar11) {
      pcVar14 = 
      "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0";
      uVar8 = 0x27b;
      goto LAB_00133e6d;
    }
    iVar11 = secp256k1_modinv32_mul_cmp_30(&g,alen,&modinfo->modulus,-1);
    if (iVar11 < 1) {
      pcVar14 = 
      "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0";
      uVar8 = 0x27c;
      goto LAB_00133e6d;
    }
    iVar11 = secp256k1_modinv32_mul_cmp_30(&g,alen,&modinfo->modulus,1);
    if (-1 < iVar11) break;
    local_114 = local_114 + 1;
  }
  pcVar14 = 
  "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0";
  uVar8 = 0x27d;
LAB_00133e6d:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
          ,uVar8,pcVar14);
  abort();
}

Assistant:

static void secp256k1_modinv32_var(secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, eta=-1. */
    secp256k1_modinv32_signed30 d = {{0, 0, 0, 0, 0, 0, 0, 0, 0}};
    secp256k1_modinv32_signed30 e = {{1, 0, 0, 0, 0, 0, 0, 0, 0}};
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
#ifdef VERIFY
    int i = 0;
#endif
    int j, len = 9;
    int32_t eta = -1; /* eta = -delta; delta is initially 1 (faster for the variable-time code) */
    int32_t cond, fn, gn;

    /* Do iterations of 30 divsteps each until g=0. */
    while (1) {
        /* Compute transition matrix and new eta after 30 divsteps. */
        secp256k1_modinv32_trans2x2 t;
        eta = secp256k1_modinv32_divsteps_30_var(eta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv32_update_de_30(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */

        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv32_update_fg_30_var(len, &f, &g, &t);
        /* If the bottom limb of g is 0, there is a chance g=0. */
        if (g.v[0] == 0) {
            cond = 0;
            /* Check if all other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= g.v[j];
            }
            /* If so, we're done. */
            if (cond == 0) break;
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0 or -1. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int32_t)len - 2) >> 31;
        cond |= fn ^ (fn >> 31);
        cond |= gn ^ (gn >> 31);
        /* If so, reduce length, propagating the sign of f and g's top limb into the one below. */
        if (cond == 0) {
            f.v[len - 2] |= (uint32_t)fn << 30;
            g.v[len - 2] |= (uint32_t)gn << 30;
            --len;
        }

        VERIFY_CHECK(++i < 25); /* We should never need more than 25*30 = 750 divsteps */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point g is 0 and (if g was not originally 0) f must now equal +/- GCD of
     * the initial f, g values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &SECP256K1_SIGNED30_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and f == modulus) */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, -1) == 0 ||
                 secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, 1) == 0 ||
                 (secp256k1_modinv32_mul_cmp_30(x, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&d, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) == 0));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv32_normalize_30(&d, f.v[len - 1], modinfo);
    *x = d;
}